

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O1

void __thiscall
ot::commissioner::CommissionerImpl::HandleRlyRx(CommissionerImpl *this,Request *aRlyRx)

{
  map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  undefined8 uVar2;
  undefined4 uVar3;
  char *pcVar4;
  ushort uVar5;
  int iVar6;
  mapped_type *pmVar7;
  ByteArray *pBVar8;
  iterator __position;
  char *pcVar9;
  ByteArray *extraout_RDX;
  ByteArray *extraout_RDX_00;
  ByteArray *extraout_RDX_01;
  ByteArray *aBytes;
  TimePoint *aTimePoint;
  ByteArray *aBytes_00;
  ByteArray *aBytes_01;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pfVar10;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *pcVar11;
  bool bVar12;
  pair<std::_Rb_tree_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>_>,_bool>
  pVar13;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  uint16_t joinerRouterLocator;
  string peerAddr;
  uint16_t joinerUdpPort;
  writer write;
  TlvPtr tlv;
  ByteArray joinerId;
  Error error;
  ByteArray dtlsRecords;
  Address localAddr;
  ByteArray joinerIid;
  string joinerPSKd;
  TlvSet tlvSet;
  undefined1 local_228 [38];
  undefined2 local_202;
  undefined1 local_200 [8];
  type *ptStack_1f8;
  char local_1f0 [8];
  type local_1e8 [4];
  undefined1 local_1d8 [8];
  _Head_base<7UL,_ot::commissioner::Address_&,_false> _Stack_1d0;
  undefined1 local_1c8 [8];
  Address AStack_1c0;
  _Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
  local_1a8;
  _Head_base<1UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_false> _Stack_1a0;
  _Head_base<0UL,_ot::commissioner::CommissionerImpl_&,_false> local_198;
  undefined1 local_182 [10];
  undefined1 local_178 [32];
  Tlv *local_158;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_150;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_148;
  undefined1 local_130 [8];
  _Alloc_hider local_128;
  size_type local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_108;
  Address local_e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  _Rb_tree<ot::commissioner::tlv::Type,_std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>,_std::_Select1st<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  local_88;
  string local_58;
  
  local_128._M_p = (pointer)&local_118;
  local_130._0_4_ = kNone;
  local_120 = 0;
  local_118._M_local_buf[0] = '\0';
  local_88._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88._M_impl.super__Rb_tree_header._M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_158 = (Tlv *)0x0;
  _Stack_150._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (byte *)0x0;
  local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88._M_impl.super__Rb_tree_header._M_header._M_left;
  commissioner::tlv::GetTlvSet((Error *)local_1d8,(TlvSet *)&local_88,&aRlyRx->mPayload,kMeshCoP);
  local_130._0_4_ = local_1d8._0_4_;
  std::__cxx11::string::operator=((string *)&local_128,(string *)&_Stack_1d0);
  uVar3 = local_130._0_4_;
  if (_Stack_1d0._M_head_impl != &AStack_1c0) {
    operator_delete(_Stack_1d0._M_head_impl);
  }
  if (uVar3 != none_type) goto LAB_0016c61d;
  local_1d8[0] = (string)0x12;
  local_182._2_8_ = this;
  pmVar7 = std::
           map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
           ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                         *)&local_88,(key_type *)local_1d8);
  local_158 = (pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&_Stack_150,
             &(pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  if (local_158 == (Tlv *)0x0) {
    local_1d8 = (undefined1  [8])((ulong)((uint7)local_1d8._1_7_ >> 0x18) << 0x20);
    pcVar11 = "no valid Joiner UDP Port TLV found";
    _Stack_1d0._M_head_impl = (Address *)0x219786;
    local_1c8 = (undefined1  [8])0x22;
    AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_1d8;
    local_178._0_8_ =
         (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)local_1d8;
    do {
      if (pcVar11 == "") break;
      pcVar9 = pcVar11;
      if (*pcVar11 == '{') {
LAB_0016c45c:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()((writer *)local_178,pcVar11,pcVar9);
        pcVar11 = ::fmt::v10::detail::
                  parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                            (pcVar9,"",(format_string_checker<char> *)local_1d8);
        bVar12 = true;
      }
      else {
        pcVar9 = pcVar11 + 1;
        bVar12 = pcVar9 != "";
        if (bVar12) {
          if (*pcVar9 != '{') {
            pcVar4 = pcVar11 + 2;
            do {
              pcVar9 = pcVar4;
              bVar12 = pcVar9 != "";
              if (pcVar9 == "") goto LAB_0016c458;
              pcVar4 = pcVar9 + 1;
            } while (*pcVar9 != '{');
          }
          bVar12 = true;
        }
LAB_0016c458:
        if (bVar12) goto LAB_0016c45c;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()((writer *)local_178,pcVar11,"");
        bVar12 = false;
      }
    } while (bVar12);
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_1d8;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)local_228,(v10 *)"no valid Joiner UDP Port TLV found",
               (string_view)ZEXT816(0x22),args_00);
    local_200._0_4_ = 8;
    ptStack_1f8 = local_1e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&ptStack_1f8,local_228._0_8_,
               (pointer)(local_228._0_8_ + (long)(ByteArray *)local_228._8_8_));
LAB_0016c5e8:
    local_130._0_4_ = local_200._0_4_;
LAB_0016c5f3:
    std::__cxx11::string::operator=((string *)&local_128,(string *)&ptStack_1f8);
    if (ptStack_1f8 != local_1e8) {
      operator_delete(ptStack_1f8);
    }
    pfVar10 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_228._0_8_;
    if ((format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_228._0_8_ ==
        (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_228 + 0x10)) goto LAB_0016c61d;
  }
  else {
    local_182._0_2_ = commissioner::tlv::Tlv::GetValueAsUint16(local_158);
    local_1d8[0] = (string)0x14;
    pmVar7 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&local_88,(key_type *)local_1d8);
    local_158 = (pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>)
                ._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&_Stack_150,
               &(pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>)
                ._M_refcount);
    if (local_158 == (Tlv *)0x0) {
      local_1d8 = (undefined1  [8])((ulong)((uint7)local_1d8._1_7_ >> 0x18) << 0x20);
      pcVar11 = "no valid Joiner Router Locator TLV found";
      _Stack_1d0._M_head_impl = (Address *)0x2197a9;
      local_1c8 = (undefined1  [8])0x28;
      AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_1d8;
      local_178._0_8_ =
           (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
            *)local_1d8;
      do {
        if (pcVar11 == "") break;
        pcVar9 = pcVar11;
        if (*pcVar11 == '{') {
LAB_0016c564:
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()((writer *)local_178,pcVar11,pcVar9);
          pcVar11 = ::fmt::v10::detail::
                    parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                              (pcVar9,"",(format_string_checker<char> *)local_1d8);
          bVar12 = true;
        }
        else {
          pcVar9 = pcVar11 + 1;
          bVar12 = pcVar9 != "";
          if (bVar12) {
            if (*pcVar9 != '{') {
              pcVar4 = pcVar11 + 2;
              do {
                pcVar9 = pcVar4;
                bVar12 = pcVar9 != "";
                if (pcVar9 == "") goto LAB_0016c560;
                pcVar4 = pcVar9 + 1;
              } while (*pcVar9 != '{');
            }
            bVar12 = true;
          }
LAB_0016c560:
          if (bVar12) goto LAB_0016c564;
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()((writer *)local_178,pcVar11,"");
          bVar12 = false;
        }
      } while (bVar12);
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)local_1d8;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)local_228,(v10 *)"no valid Joiner Router Locator TLV found",
                 (string_view)ZEXT816(0x28),args_01);
      local_200._0_4_ = 8;
      ptStack_1f8 = local_1e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&ptStack_1f8,local_228._0_8_,
                 (pointer)(local_228._0_8_ + (long)(ByteArray *)local_228._8_8_));
      goto LAB_0016c5e8;
    }
    local_202 = commissioner::tlv::Tlv::GetValueAsUint16(local_158);
    local_1d8[0] = (string)0x13;
    pmVar7 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&local_88,(key_type *)local_1d8);
    local_158 = (pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>)
                ._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&_Stack_150,
               &(pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>)
                ._M_refcount);
    if (local_158 == (Tlv *)0x0) {
      local_1d8 = (undefined1  [8])((ulong)((uint7)local_1d8._1_7_ >> 0x18) << 0x20);
      _Stack_1d0._M_head_impl = (Address *)0x2197d2;
      local_1c8 = (undefined1  [8])0x1d;
      AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pcVar11 = "no valid Joiner IID TLV found";
      AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_1d8;
      do {
        pcVar9 = pcVar11 + 1;
        if (*pcVar11 == '}') {
          if ((pcVar9 == "") || (*pcVar9 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar9 = pcVar11 + 2;
        }
        else if (*pcVar11 == '{') {
          pcVar9 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar11,"",(format_string_checker<char> *)local_1d8);
        }
        pcVar11 = pcVar9;
      } while (pcVar9 != "");
      args_03.field_1.args_ = in_R9.args_;
      args_03.desc_ = (unsigned_long_long)local_1d8;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)local_228,(v10 *)"no valid Joiner IID TLV found",
                 (string_view)ZEXT816(0x1d),args_03);
      local_200._0_4_ = 8;
      ptStack_1f8 = local_1e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&ptStack_1f8,local_228._0_8_,
                 (pointer)(local_228._0_8_ + (long)(ByteArray *)local_228._8_8_));
      local_130._0_4_ = local_200._0_4_;
      goto LAB_0016c5f3;
    }
    pBVar8 = commissioner::tlv::Tlv::GetValue(local_158);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&local_c8,pBVar8);
    local_1d8[0] = (string)0x11;
    pmVar7 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&local_88,local_1d8);
    local_158 = (pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>)
                ._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&_Stack_150,
               &(pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>)
                ._M_refcount);
    if (local_158 == (Tlv *)0x0) {
      local_1d8 = (undefined1  [8])((ulong)local_1d8 & 0xffffffff00000000);
      pcVar11 = "no valid Joiner DTLS Encapsulation TLV found";
      _Stack_1d0._M_head_impl = (Address *)0x2197f0;
      local_1c8 = (undefined1  [8])0x2c;
      AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = local_1d8;
      AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_178._0_8_ =
           AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      do {
        if (pcVar11 == "") break;
        pcVar9 = pcVar11;
        if (*pcVar11 == '{') {
LAB_0016c994:
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()((writer *)local_178,pcVar11,pcVar9);
          pcVar11 = ::fmt::v10::detail::
                    parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                              (pcVar9,"",(format_string_checker<char> *)local_1d8);
          bVar12 = true;
        }
        else {
          pcVar9 = pcVar11 + 1;
          bVar12 = pcVar9 != "";
          if (bVar12) {
            if (*pcVar9 != '{') {
              pcVar4 = pcVar11 + 2;
              do {
                pcVar9 = pcVar4;
                bVar12 = pcVar9 != "";
                if (pcVar9 == "") goto LAB_0016c990;
                pcVar4 = pcVar9 + 1;
              } while (*pcVar9 != '{');
            }
            bVar12 = true;
          }
LAB_0016c990:
          if (bVar12) goto LAB_0016c994;
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()((writer *)local_178,pcVar11,"");
          bVar12 = false;
        }
      } while (bVar12);
      args_04.field_1.args_ = in_R9.args_;
      args_04.desc_ = (unsigned_long_long)local_1d8;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)local_228,(v10 *)"no valid Joiner DTLS Encapsulation TLV found",
                 (string_view)ZEXT816(0x2c),args_04);
      local_200._0_4_ = 8;
      ptStack_1f8 = local_1e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&ptStack_1f8,local_228._0_8_,
                 (pointer)(local_228._0_8_ + (long)(ByteArray *)local_228._8_8_));
      local_130._0_4_ = local_200._0_4_;
      goto LAB_0016c5f3;
    }
    pBVar8 = commissioner::tlv::Tlv::GetValue(local_158);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&local_108,pBVar8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&local_148,&local_c8);
    *local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_start =
         *local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start ^ 2;
    local_200 = (undefined1  [8])local_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"joiner-session","");
    local_1d8 = (undefined1  [8])0x20000000d;
    _Stack_1d0._M_head_impl._0_4_ = 4;
    pcVar11 = "received RLY_RX.ntf: joinerID={}, joinerRouterLocator={}, length={}";
    local_1c8 = (undefined1  [8])0x21981d;
    AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x43;
    AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x300000000;
    AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_1d8;
    local_1a8._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ::fmt::v10::detail::
         parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
    _Stack_1a0._M_head_impl =
         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
         ::fmt::v10::detail::
         parse_format_specs<unsigned_short,fmt::v10::detail::compile_parse_context<char>>;
    local_198._M_head_impl =
         (CommissionerImpl *)
         ::fmt::v10::detail::
         parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
    pBVar8 = extraout_RDX;
    local_178._0_8_ =
         AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
         .super__Vector_impl_data._M_end_of_storage;
    do {
      if (pcVar11 == "") break;
      pcVar9 = pcVar11;
      if (*pcVar11 == '{') {
LAB_0016c27a:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_unsigned_long>_>
        ::writer::operator()((writer *)local_178,pcVar11,pcVar9);
        pcVar11 = ::fmt::v10::detail::
                  parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,unsigned_short,unsigned_long>&>
                            (pcVar9,"",
                             (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                              *)local_1d8);
        bVar12 = true;
        pBVar8 = extraout_RDX_00;
      }
      else {
        pcVar9 = pcVar11 + 1;
        bVar12 = pcVar9 != "";
        if (bVar12) {
          if (*pcVar9 != '{') {
            pcVar4 = pcVar11 + 2;
            do {
              pcVar9 = pcVar4;
              bVar12 = pcVar9 != "";
              if (pcVar9 == "") goto LAB_0016c276;
              pcVar4 = pcVar9 + 1;
            } while (*pcVar9 != '{');
          }
          bVar12 = true;
        }
LAB_0016c276:
        if (bVar12) goto LAB_0016c27a;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_unsigned_long>_>
        ::writer::operator()((writer *)local_178,pcVar11,"");
        bVar12 = false;
        pBVar8 = extraout_RDX_01;
      }
    } while (bVar12);
    utils::Hex_abi_cxx11_((string *)local_178,(utils *)&local_148,pBVar8);
    AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish +
         -(long)local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_1c8 = (undefined1  [8])(ulong)(ushort)local_202;
    local_1d8 = (undefined1  [8])local_178._0_8_;
    _Stack_1d0._M_head_impl = (Address *)local_178._8_8_;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_1d8;
    fmt.size_ = 0x42d;
    fmt.data_ = (char *)0x43;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)local_228,
               (v10 *)"received RLY_RX.ntf: joinerID={}, joinerRouterLocator={}, length={}",fmt,args
              );
    uVar2 = local_182._2_8_;
    Log(kDebug,(string *)local_200,(string *)local_228);
    if ((format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_228._0_8_ !=
        (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_228 + 0x10)) {
      operator_delete((void *)local_228._0_8_);
    }
    if ((format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
         *)local_178._0_8_ !=
        (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
         *)(local_178 + 0x10)) {
      operator_delete((void *)local_178._0_8_);
    }
    if (local_200 != (undefined1  [8])local_1f0) {
      operator_delete((void *)local_200);
    }
    this_00 = (map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>_>_>
               *)(uVar2 + 0x1060);
    __position = std::
                 _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>,_std::_Select1st<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>_>_>
                 ::find((_Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>,_std::_Select1st<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>_>_>
                         *)this_00,&local_148);
    p_Var1 = &(((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>_>_>
                 *)(local_182._2_8_ + 0x1060))->_M_t)._M_impl.super__Rb_tree_header;
    if (((_Rb_tree_header *)__position._M_node != p_Var1) &&
       (*(int *)(*(long *)(__position._M_node + 5) + 0xf8) == 0)) {
      std::
      _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>>
      ::erase_abi_cxx11_((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>>
                          *)this_00,__position);
      __position._M_node = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)__position._M_node != p_Var1) {
LAB_0016c3bb:
      if ((_Rb_tree_header *)__position._M_node == p_Var1) {
        __assert_fail("condition",
                      "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp"
                      ,0xa34,
                      "void ot::commissioner::CommissionerImpl::HandleRlyRx(const coap::Request &)")
        ;
      }
      JoinerSession::RecvJoinerDtlsRecords
                ((JoinerSession *)&__position._M_node[1]._M_right,&local_108);
      goto LAB_0016c61d;
    }
    local_e8.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (**(*(CommissionerHandler **)(local_182._2_8_ + 0x10))->_vptr_CommissionerHandler)
              (local_1d8,*(CommissionerHandler **)(local_182._2_8_ + 0x10),&local_148);
    std::__cxx11::string::operator=((string *)&local_a8,(string *)local_1d8);
    if (local_1d8 != (undefined1  [8])local_1c8) {
      operator_delete((void *)local_1d8);
    }
    if (local_a8._M_string_length == 0) {
      local_1d8 = (undefined1  [8])local_1c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"joiner-session","");
      ::fmt::v10::detail::
      check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FMT_COMPILE_STRING,_0>
                ();
      utils::Hex_abi_cxx11_((string *)local_228,(utils *)&local_148,aBytes_00);
      local_178._0_8_ = local_228._0_8_;
      local_178._8_8_ = local_228._8_8_;
      args_07.field_1.args_ = in_R9.args_;
      args_07.desc_ = (unsigned_long_long)local_178;
      fmt_03.size_ = 0xd;
      fmt_03.data_ = (char *)0x19;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)local_200,(v10 *)"joiner(ID={}) is disabled",fmt_03,args_07);
      Log(kInfo,(string *)local_1d8,(string *)local_200);
      if (local_200 != (undefined1  [8])local_1f0) {
        operator_delete((void *)local_200);
      }
      if ((format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_228._0_8_ !=
          (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_228 + 0x10)) {
        operator_delete((void *)local_228._0_8_);
      }
      if (local_1d8 != (undefined1  [8])local_1c8) {
        operator_delete((void *)local_1d8);
      }
      ::fmt::v10::detail::
      check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FMT_COMPILE_STRING,_0>
                ();
      utils::Hex_abi_cxx11_((string *)local_228,(utils *)&local_148,aBytes_01);
      local_178._0_8_ = local_228._0_8_;
      local_178._8_8_ = local_228._8_8_;
      args_08.field_1.args_ = in_R9.args_;
      args_08.desc_ = (unsigned_long_long)local_178;
      fmt_04.size_ = 0xd;
      fmt_04.data_ = (char *)0x19;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)local_200,(v10 *)"joiner(ID={}) is disabled",fmt_04,args_08);
      local_1d8._0_4_ = 0x10;
      _Stack_1d0._M_head_impl = &AStack_1c0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&_Stack_1d0,local_200,(char *)((long)ptStack_1f8 + (long)local_200));
      local_130._0_4_ = local_1d8._0_4_;
      std::__cxx11::string::operator=((string *)&local_128,(string *)&_Stack_1d0);
      if (_Stack_1d0._M_head_impl != &AStack_1c0) {
        operator_delete(_Stack_1d0._M_head_impl);
      }
      if (local_200 != (undefined1  [8])local_1f0) {
        operator_delete((void *)local_200);
      }
      if ((format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_228._0_8_ !=
          (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_228 + 0x10)) {
        operator_delete((void *)local_228._0_8_);
      }
    }
    else {
      coap::CoapSecure::GetLocalAddr
                ((Error *)local_1d8,(CoapSecure *)(local_182._2_8_ + 0x1d0),&local_e8);
      local_130._0_4_ = local_1d8._0_4_;
      std::__cxx11::string::operator=((string *)&local_128,(string *)&_Stack_1d0);
      uVar3 = local_130._0_4_;
      if (_Stack_1d0._M_head_impl != &AStack_1c0) {
        operator_delete(_Stack_1d0._M_head_impl);
      }
      if (uVar3 == none_type) {
        local_228._0_8_ = &local_148;
        (*aRlyRx->mEndpoint->_vptr_Endpoint[3])();
        iVar6 = (*aRlyRx->mEndpoint->_vptr_Endpoint[4])();
        local_178._0_2_ = (short)iVar6;
        local_1d8 = (undefined1  [8])&kListeningJoinerPort;
        _Stack_1d0._M_head_impl = &local_e8;
        local_1c8 = (undefined1  [8])local_178;
        AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)&local_202;
        AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = local_182;
        local_1a8._M_head_impl = &local_a8;
        local_198._M_head_impl = (CommissionerImpl *)local_182._2_8_;
        AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = local_200;
        _Stack_1a0._M_head_impl = &local_148;
        pVar13 = std::
                 _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>>
                 ::
                 _M_emplace_unique<std::piecewise_construct_t_const&,std::tuple<std::vector<unsigned_char,std::allocator<unsigned_char>>&>,std::tuple<ot::commissioner::CommissionerImpl&,std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::__cxx11::string&,unsigned_short&,unsigned_short&,ot::commissioner::Address&&,unsigned_short&&,ot::commissioner::Address&,unsigned_short_const&>>
                           ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>>
                             *)this_00,(piecewise_construct_t *)&std::piecewise_construct,
                            (tuple<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&> *)
                            local_228,
                            (tuple<ot::commissioner::CommissionerImpl_&,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short_&,_unsigned_short_&,_ot::commissioner::Address_&&,_unsigned_short_&&,_ot::commissioner::Address_&,_const_unsigned_short_&>
                             *)local_1d8);
        __position._M_node = (_Base_ptr)pVar13.first._M_node;
        if (local_200 != (undefined1  [8])0x0) {
          operator_delete((void *)local_200);
        }
        (**(code **)(**(long **)(__position._M_node + 5) + 0x18))(local_1d8);
        Address::ToString_abi_cxx11_((string *)local_200,(Address *)local_1d8);
        if (local_1d8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_1d8);
        }
        local_228._0_8_ = local_228 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"joiner-session","");
        ::fmt::v10::detail::
        check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short,_FMT_COMPILE_STRING,_0>
                  ();
        utils::Hex_abi_cxx11_(&local_58,(utils *)&local_148,aBytes);
        uVar5 = (**(code **)(**(long **)(__position._M_node + 5) + 0x20))();
        AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)(ulong)uVar5;
        local_1d8 = (undefined1  [8])local_58._M_dataplus._M_p;
        _Stack_1d0._M_head_impl = (Address *)local_58._M_string_length;
        local_1c8 = local_200;
        AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)ptStack_1f8;
        args_05.field_1.args_ = in_R9.args_;
        args_05.desc_ = (unsigned_long_long)local_1d8;
        fmt_01.size_ = 0x2dd;
        fmt_01.data_ = (char *)0x39;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)local_178,
                   (v10 *)"received a new joiner(ID={}) DTLS connection from [{}]:{}",fmt_01,args_05
                  );
        Log(kDebug,(string *)local_228,(string *)local_178);
        if ((format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)local_178._0_8_ !=
            (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)(local_178 + 0x10)) {
          operator_delete((void *)local_178._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        if ((format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_228._0_8_ !=
            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_228 + 0x10)) {
          operator_delete((void *)local_228._0_8_);
        }
        JoinerSession::Connect((JoinerSession *)&__position._M_node[1]._M_right);
        local_1d8 = (undefined1  [8])local_1c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"joiner-session","");
        ::fmt::v10::detail::
        check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FMT_COMPILE_STRING,_0>
                  ();
        TimePointToString_abi_cxx11_
                  ((string *)local_178,(commissioner *)(__position._M_node + 0x19),aTimePoint);
        local_58._M_dataplus._M_p = (pointer)local_178._0_8_;
        local_58._M_string_length = local_178._8_8_;
        args_06.field_1.args_ = in_R9.args_;
        args_06.desc_ = (unsigned_long_long)&local_58;
        fmt_02.size_ = 0xd;
        fmt_02.data_ = (char *)0x30;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)local_228,(v10 *)"joiner session timer started, expiration-time={}",
                   fmt_02,args_06);
        Log(kInfo,(string *)local_1d8,(string *)local_228);
        if ((format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_228._0_8_ !=
            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_228 + 0x10)) {
          operator_delete((void *)local_228._0_8_);
        }
        if ((format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)local_178._0_8_ !=
            (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)(local_178 + 0x10)) {
          operator_delete((void *)local_178._0_8_);
        }
        if (local_1d8 != (undefined1  [8])local_1c8) {
          operator_delete((void *)local_1d8);
        }
        Timer::Start((Timer *)(local_182._2_8_ + 0x1090),
                     (duration)*(duration *)(__position._M_node + 0x19));
        if (local_200 != (undefined1  [8])local_1f0) {
          operator_delete((void *)local_200);
        }
        if ((format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_e8.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start !=
            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x0) {
          operator_delete(local_e8.mBytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        goto LAB_0016c3bb;
      }
    }
    pfVar10 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_e8.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    if ((format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_e8.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start ==
        (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)0x0) goto LAB_0016c61d;
  }
  operator_delete(pfVar10);
LAB_0016c61d:
  if (local_130._0_4_ != none_type) {
    local_200 = (undefined1  [8])local_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"joiner-session","");
    local_1d8._0_4_ = 0xd;
    pcVar11 = "failed to handle RLY_RX.ntf message: {}";
    _Stack_1d0._M_head_impl = (Address *)0x2198e6;
    local_1c8 = (undefined1  [8])0x27;
    AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x100000000;
    AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)::fmt::v10::detail::
                  parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_1d8;
    local_178._0_8_ =
         (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)local_1d8;
    do {
      if (pcVar11 == "") break;
      pcVar9 = pcVar11;
      if (*pcVar11 == '{') {
LAB_0016c6df:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()((writer *)local_178,pcVar11,pcVar9);
        pcVar11 = ::fmt::v10::detail::
                  parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                            (pcVar9,"",
                             (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_1d8);
        bVar12 = true;
      }
      else {
        pcVar9 = pcVar11 + 1;
        bVar12 = pcVar9 != "";
        if (bVar12) {
          if (*pcVar9 != '{') {
            pcVar4 = pcVar11 + 2;
            do {
              pcVar9 = pcVar4;
              bVar12 = pcVar9 != "";
              if (pcVar9 == "") goto LAB_0016c6db;
              pcVar4 = pcVar9 + 1;
            } while (*pcVar9 != '{');
          }
          bVar12 = true;
        }
LAB_0016c6db:
        if (bVar12) goto LAB_0016c6df;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()((writer *)local_178,pcVar11,"");
        bVar12 = false;
      }
    } while (bVar12);
    Error::ToString_abi_cxx11_((string *)local_1d8,(Error *)local_130);
    local_178._0_8_ = local_1d8;
    local_178._8_8_ = _Stack_1d0._M_head_impl;
    args_02.field_1.args_ = in_R9.args_;
    args_02.desc_ = (unsigned_long_long)local_178;
    fmt_00.size_ = 0xd;
    fmt_00.data_ = (char *)0x27;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)local_228,(v10 *)"failed to handle RLY_RX.ntf message: {}",fmt_00,args_02);
    Log(kError,(string *)local_200,(string *)local_228);
    if ((format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_228._0_8_ !=
        (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_228 + 0x10)) {
      operator_delete((void *)local_228._0_8_);
    }
    if (local_1d8 != (undefined1  [8])local_1c8) {
      operator_delete((void *)local_1d8);
    }
    if (local_200 != (undefined1  [8])local_1f0) {
      operator_delete((void *)local_200);
    }
  }
  if (local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (byte *)0x0) {
    operator_delete(local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (_Stack_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_150._M_pi);
  }
  std::
  _Rb_tree<ot::commissioner::tlv::Type,_std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>,_std::_Select1st<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  ::~_Rb_tree(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_p != &local_118) {
    operator_delete(local_128._M_p);
  }
  return;
}

Assistant:

void CommissionerImpl::HandleRlyRx(const coap::Request &aRlyRx)
{
    Error       error;
    tlv::TlvSet tlvSet;
    tlv::TlvPtr tlv;

    std::string joinerPSKd;
    uint16_t    joinerUdpPort;
    uint16_t    joinerRouterLocator;
    ByteArray   joinerIid;
    ByteArray   joinerId;
    ByteArray   dtlsRecords;

    SuccessOrExit(error = GetTlvSet(tlvSet, aRlyRx));

    VerifyOrExit((tlv = tlvSet[tlv::Type::kJoinerUdpPort]) != nullptr,
                 error = ERROR_BAD_FORMAT("no valid Joiner UDP Port TLV found"));
    joinerUdpPort = tlv->GetValueAsUint16();

    VerifyOrExit((tlv = tlvSet[tlv::Type::kJoinerRouterLocator]) != nullptr,
                 error = ERROR_BAD_FORMAT("no valid Joiner Router Locator TLV found"));
    joinerRouterLocator = tlv->GetValueAsUint16();

    VerifyOrExit((tlv = tlvSet[tlv::Type::kJoinerIID]) != nullptr,
                 error = ERROR_BAD_FORMAT("no valid Joiner IID TLV found"));
    joinerIid = tlv->GetValue();

    VerifyOrExit((tlv = tlvSet[tlv::Type::kJoinerDtlsEncapsulation]) != nullptr,
                 error = ERROR_BAD_FORMAT("no valid Joiner DTLS Encapsulation TLV found"));
    dtlsRecords = tlv->GetValue();

    joinerId = joinerIid;
    joinerId[0] ^= kLocalExternalAddrMask;
    LOG_DEBUG(LOG_REGION_JOINER_SESSION, "received RLY_RX.ntf: joinerID={}, joinerRouterLocator={}, length={}",
              utils::Hex(joinerId), joinerRouterLocator, dtlsRecords.size());

    {
        auto it = mJoinerSessions.find(joinerId);
        if (it != mJoinerSessions.end() && it->second.Disabled())
        {
            mJoinerSessions.erase(it);
            it = mJoinerSessions.end();
        }

        if (it == mJoinerSessions.end())
        {
            Address localAddr;

            joinerPSKd = mCommissionerHandler.OnJoinerRequest(joinerId);
            if (joinerPSKd.empty())
            {
                LOG_INFO(LOG_REGION_JOINER_SESSION, "joiner(ID={}) is disabled", utils::Hex(joinerId));
                ExitNow(error = ERROR_REJECTED("joiner(ID={}) is disabled", utils::Hex(joinerId)));
            }

            SuccessOrExit(error = mBrClient.GetLocalAddr(localAddr));
            it = mJoinerSessions
                     .emplace(std::piecewise_construct, std::forward_as_tuple(joinerId),
                              std::forward_as_tuple(*this, joinerId, joinerPSKd, joinerUdpPort, joinerRouterLocator,
                                                    aRlyRx.GetEndpoint()->GetPeerAddr(),
                                                    aRlyRx.GetEndpoint()->GetPeerPort(), localAddr,
                                                    kListeningJoinerPort))
                     .first;
            auto &session = it->second;

            std::string peerAddr = session.GetPeerAddr().ToString();

            LOG_DEBUG(LOG_REGION_JOINER_SESSION, "received a new joiner(ID={}) DTLS connection from [{}]:{}",
                      utils::Hex(joinerId), peerAddr, session.GetPeerPort());

            session.Connect();

            LOG_INFO(LOG_REGION_JOINER_SESSION, "joiner session timer started, expiration-time={}",
                     TimePointToString(session.GetExpirationTime()));
            mJoinerSessionTimer.Start(session.GetExpirationTime());
        }

        ASSERT(it != mJoinerSessions.end());
        auto &session = it->second;
        session.RecvJoinerDtlsRecords(dtlsRecords);
    }

exit:
    if (error != ErrorCode::kNone)
    {
        LOG_ERROR(LOG_REGION_JOINER_SESSION, "failed to handle RLY_RX.ntf message: {}", error.ToString());
    }
}